

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::BlockReferencedByShaderValidator::
getHumanReadablePropertyString_abi_cxx11_(string *__return_storage_ptr__,void *this,GLint propVal)

{
  undefined4 in_register_00000014;
  code *local_18;
  GLint local_10;
  
  local_18 = glu::getBooleanName;
  local_10 = propVal;
  de::toString<tcu::Format::Enum<int,2ul>>
            (__return_storage_ptr__,(de *)&local_18,
             (Enum<int,_2UL> *)CONCAT44(in_register_00000014,propVal));
  return __return_storage_ptr__;
}

Assistant:

std::string BlockReferencedByShaderValidator::getHumanReadablePropertyString (glw::GLint propVal) const
{
	return de::toString(glu::getBooleanStr(propVal));
}